

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

bool JSON::checkSchemaInternal
               (JSON_value *this_v,JSON_value *sch_v,unsigned_long flags,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors,string *prefix)

{
  ulong uVar1;
  size_type sVar2;
  pointer ppVar3;
  char *pcVar4;
  __shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  pointer pJVar7;
  pointer pJVar8;
  size_type __val;
  size_type sVar9;
  bool bVar10;
  undefined8 local_540;
  long local_530;
  long local_520;
  long local_510;
  long local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  __shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_468;
  JSON *element_1;
  iterator __end6_1;
  iterator __begin6_1;
  vector<JSON,_std::allocator<JSON>_> *__range6_1;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  __shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_360;
  JSON *element;
  iterator __end6;
  iterator __begin6;
  vector<JSON,_std::allocator<JSON>_> *__range6;
  int i;
  size_type n_elements;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  reference local_2d0;
  string *key_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>
  *iter_2;
  iterator __end3_1;
  iterator __begin3_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  *__range3_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  reference local_208;
  string *key_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>
  *iter_1;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  reference local_1a0;
  string *key_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>
  *iter;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  *__range2;
  pointer pattern_schema;
  string local_168 [8];
  string key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  members;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string pattern_key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_80 [8];
  string err_prefix;
  JSON_string *sch_str;
  JSON_dictionary *sch_dict;
  JSON_array *sch_arr;
  JSON_dictionary *this_dict;
  JSON_array *this_arr;
  string *prefix_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *errors_local;
  unsigned_long flags_local;
  JSON_value *sch_v_local;
  JSON_value *this_v_local;
  
  if (this_v == (JSON_value *)0x0) {
    local_500 = 0;
    local_510 = 0;
  }
  else {
    local_500 = __dynamic_cast(this_v,&JSON_value::typeinfo,&JSON_array::typeinfo,0);
    local_510 = __dynamic_cast(this_v,&JSON_value::typeinfo,&JSON_dictionary::typeinfo,0);
  }
  if (sch_v == (JSON_value *)0x0) {
    local_520 = 0;
    local_530 = 0;
    local_540 = 0;
  }
  else {
    local_520 = __dynamic_cast(sch_v,&JSON_value::typeinfo,&JSON_array::typeinfo,0);
    local_530 = __dynamic_cast(sch_v,&JSON_value::typeinfo,&JSON_dictionary::typeinfo,0);
    local_540 = __dynamic_cast(sch_v,&JSON_value::typeinfo,&JSON_string::typeinfo,0);
  }
  err_prefix.field_2._8_8_ = local_540;
  std::__cxx11::string::string((string *)local_80);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&pattern_key.field_2 + 8),"json key \"",prefix);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&pattern_key.field_2 + 8),"\"");
    std::__cxx11::string::operator=((string *)local_80,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)(pattern_key.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::operator=((string *)local_80,"top-level object");
  }
  std::__cxx11::string::string((string *)local_f0);
  if (local_530 != 0) {
    if (local_510 == 0) {
      QTC::TC("libtests","JSON wanted dictionary",0);
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     " is supposed to be a dictionary");
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(errors,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      this_v_local._7_1_ = false;
      goto LAB_0012953f;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
           *)((long)&key.field_2 + 8),
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
           *)(local_530 + 0x10));
    std::__cxx11::string::string(local_168);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                    *)((long)&key.field_2 + 8));
    bVar10 = false;
    if (sVar2 == 1) {
      pattern_schema =
           (pointer)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                    ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                             *)((long)&key.field_2 + 8));
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
                             *)&pattern_schema);
      std::__cxx11::string::operator=(local_168,(string *)ppVar3);
      uVar1 = std::__cxx11::string::length();
      bVar10 = false;
      if (2 < uVar1) {
        pcVar4 = (char *)std::__cxx11::string::at((ulong)local_168);
        bVar10 = false;
        if (*pcVar4 == '<') {
          std::__cxx11::string::length();
          pcVar4 = (char *)std::__cxx11::string::at((ulong)local_168);
          bVar10 = *pcVar4 == '>';
        }
      }
    }
    if (bVar10) {
      std::__cxx11::string::operator=((string *)local_f0,local_168);
    }
    std::__cxx11::string::~string(local_168);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
            *)((long)&key.field_2 + 8));
  }
  if ((local_530 == 0) || (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) != 0)) {
    if (local_530 == 0) {
      if (local_520 == 0) {
        if (err_prefix.field_2._8_8_ == 0) {
          QTC::TC("libtests","JSON schema other type",0);
          std::operator+(&local_4e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80," schema value is not dictionary, array, or string");
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(errors,&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
          this_v_local._7_1_ = false;
          goto LAB_0012953f;
        }
      }
      else {
        __val = std::vector<JSON,_std::allocator<JSON>_>::size
                          ((vector<JSON,_std::allocator<JSON>_> *)(local_520 + 0x10));
        if (__val == 1) {
          if (local_500 == 0) {
            QTC::TC("libtests","JSON schema array for single item",0);
            p_Var5 = (__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )std::vector<JSON,_std::allocator<JSON>_>::at
                                ((vector<JSON,_std::allocator<JSON>_> *)(local_520 + 0x10),0);
            peVar6 = std::
                     __shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Var5);
            pJVar7 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                               (&peVar6->value);
            std::__cxx11::string::string((string *)&local_3e0,(string *)prefix);
            checkSchemaInternal(this_v,pJVar7,flags,errors,&local_3e0);
            std::__cxx11::string::~string((string *)&local_3e0);
          }
          else {
            __range6._4_4_ = 0;
            __end6 = std::vector<JSON,_std::allocator<JSON>_>::begin
                               ((vector<JSON,_std::allocator<JSON>_> *)(local_500 + 0x10));
            element = (JSON *)std::vector<JSON,_std::allocator<JSON>_>::end
                                        ((vector<JSON,_std::allocator<JSON>_> *)(local_500 + 0x10));
            while (bVar10 = __gnu_cxx::operator!=
                                      (&__end6,(__normal_iterator<JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>
                                                *)&element), bVar10) {
              local_360 = (__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)__gnu_cxx::
                             __normal_iterator<JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>::
                             operator*(&__end6);
              peVar6 = std::
                       __shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->(local_360);
              pJVar7 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::
                       get(&peVar6->value);
              p_Var5 = (__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)std::vector<JSON,_std::allocator<JSON>_>::at
                                    ((vector<JSON,_std::allocator<JSON>_> *)(local_520 + 0x10),0);
              peVar6 = std::
                       __shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->(p_Var5);
              pJVar8 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::
                       get(&peVar6->value);
              std::operator+(&local_3a0,prefix,".");
              std::__cxx11::to_string(&local_3c0,__range6._4_4_);
              std::operator+(&local_380,&local_3a0,&local_3c0);
              checkSchemaInternal(pJVar7,pJVar8,flags,errors,&local_380);
              std::__cxx11::string::~string((string *)&local_380);
              std::__cxx11::string::~string((string *)&local_3c0);
              std::__cxx11::string::~string((string *)&local_3a0);
              __range6._4_4_ = __range6._4_4_ + 1;
              __gnu_cxx::__normal_iterator<JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>::
              operator++(&__end6);
            }
          }
        }
        else {
          if ((local_500 == 0) ||
             (sVar9 = std::vector<JSON,_std::allocator<JSON>_>::size
                                ((vector<JSON,_std::allocator<JSON>_> *)(local_500 + 0x10)),
             sVar9 != __val)) {
            QTC::TC("libtests","JSON schema array length mismatch",0);
            std::operator+(&local_420,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80," is supposed to be an array of length ");
            std::__cxx11::to_string((string *)&i_1,__val);
            std::operator+(&local_400,&local_420,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1
                          );
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(errors,&local_400);
            std::__cxx11::string::~string((string *)&local_400);
            std::__cxx11::string::~string((string *)&i_1);
            std::__cxx11::string::~string((string *)&local_420);
            this_v_local._7_1_ = false;
            goto LAB_0012953f;
          }
          __range6_1 = (vector<JSON,_std::allocator<JSON>_> *)0x0;
          __end6_1 = std::vector<JSON,_std::allocator<JSON>_>::begin
                               ((vector<JSON,_std::allocator<JSON>_> *)(local_500 + 0x10));
          element_1 = (JSON *)std::vector<JSON,_std::allocator<JSON>_>::end
                                        ((vector<JSON,_std::allocator<JSON>_> *)(local_500 + 0x10));
          while (bVar10 = __gnu_cxx::operator!=
                                    (&__end6_1,
                                     (__normal_iterator<JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>
                                      *)&element_1), bVar10) {
            local_468 = (__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)__gnu_cxx::
                           __normal_iterator<JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>::
                           operator*(&__end6_1);
            peVar6 = std::
                     __shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(local_468);
            pJVar7 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                               (&peVar6->value);
            p_Var5 = (__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )std::vector<JSON,_std::allocator<JSON>_>::at
                                ((vector<JSON,_std::allocator<JSON>_> *)(local_520 + 0x10),
                                 (size_type)__range6_1);
            peVar6 = std::
                     __shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Var5);
            pJVar8 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                               (&peVar6->value);
            std::operator+(&local_4a8,prefix,".");
            std::__cxx11::to_string(&local_4c8,(unsigned_long)__range6_1);
            std::operator+(&local_488,&local_4a8,&local_4c8);
            checkSchemaInternal(pJVar7,pJVar8,flags,errors,&local_488);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::~string((string *)&local_4c8);
            std::__cxx11::string::~string((string *)&local_4a8);
            __range6_1 = (vector<JSON,_std::allocator<JSON>_> *)
                         ((long)&(__range6_1->super__Vector_base<JSON,_std::allocator<JSON>_>).
                                 _M_impl.super__Vector_impl_data._M_start + 1);
            __gnu_cxx::__normal_iterator<JSON_*,_std::vector<JSON,_std::allocator<JSON>_>_>::
            operator++(&__end6_1);
          }
        }
      }
    }
    else {
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                        *)(local_530 + 0x10));
      iter_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                         *)(local_530 + 0x10));
      while (bVar10 = std::operator!=(&__end3,(_Self *)&iter_1), bVar10) {
        local_208 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
                    ::operator*(&__end3);
        key_2 = &local_208->first;
        sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                         *)(local_510 + 0x10),&local_208->first);
        if (sVar2 == 0) {
          if ((flags & 1) == 0) {
            QTC::TC("libtests","JSON key missing in object",0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__range3_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,": key \"");
            std::operator+(&local_288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__range3_1,&local_208->first);
            std::operator+(&local_268,&local_288,"\" is present in schema but missing in object");
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(errors,&local_268);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&__range3_1);
          }
          else {
            QTC::TC("libtests","JSON optional key",0);
          }
        }
        else {
          p_Var5 = (__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                                 *)(local_510 + 0x10),&local_208->first);
          peVar6 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var5);
          pJVar7 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                             (&peVar6->value);
          peVar6 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(key_2 + 1));
          pJVar8 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                             (&peVar6->value);
          std::operator+(&local_248,prefix,".");
          std::operator+(&local_228,&local_248,&local_208->first);
          checkSchemaInternal(pJVar7,pJVar8,flags,errors,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_248);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
        ::operator++(&__end3);
      }
      __end3_1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                          *)(local_510 + 0x10));
      iter_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                         *)(local_510 + 0x10));
      while (bVar10 = std::operator!=(&__end3_1,(_Self *)&iter_2), bVar10) {
        local_2d0 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
                    ::operator*(&__end3_1);
        key_3 = &local_2d0->first;
        sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                         *)(local_530 + 0x10),&local_2d0->first);
        if (sVar2 == 0) {
          QTC::TC("libtests","JSON key extra in object",0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &n_elements,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,": key \"");
          std::operator+(&local_310,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &n_elements,&local_2d0->first);
          std::operator+(&local_2f0,&local_310,"\" is not present in schema but appears in object");
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(errors,&local_2f0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&n_elements);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
        ::operator++(&__end3_1);
      }
    }
  }
  else {
    p_Var5 = (__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                           *)(local_530 + 0x10),(key_type *)local_f0);
    peVar6 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var5);
    pJVar7 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                       (&peVar6->value);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                      *)(local_510 + 0x10));
    iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                     *)(local_510 + 0x10));
    while (bVar10 = std::operator!=(&__end2,(_Self *)&iter), bVar10) {
      local_1a0 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
                  ::operator*(&__end2);
      key_1 = &local_1a0->first;
      p_Var5 = (__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                             *)(local_510 + 0x10),&local_1a0->first);
      peVar6 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var5);
      pJVar8 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                         (&peVar6->value);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                     prefix,".");
      std::operator+(&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                     &local_1a0->first);
      checkSchemaInternal(pJVar8,pJVar7,flags,errors,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&__range3);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
      ::operator++(&__end2);
    }
  }
  this_v_local._7_1_ =
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::empty(errors);
LAB_0012953f:
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_80);
  return this_v_local._7_1_;
}

Assistant:

bool
JSON::checkSchemaInternal(
    JSON_value* this_v,
    JSON_value* sch_v,
    unsigned long flags,
    std::list<std::string>& errors,
    std::string prefix)
{
    auto* this_arr = dynamic_cast<JSON_array*>(this_v);
    auto* this_dict = dynamic_cast<JSON_dictionary*>(this_v);

    auto* sch_arr = dynamic_cast<JSON_array*>(sch_v);
    auto* sch_dict = dynamic_cast<JSON_dictionary*>(sch_v);

    auto* sch_str = dynamic_cast<JSON_string*>(sch_v);

    std::string err_prefix;
    if (prefix.empty()) {
        err_prefix = "top-level object";
    } else {
        err_prefix = "json key \"" + prefix + "\"";
    }

    std::string pattern_key;
    if (sch_dict) {
        if (!this_dict) {
            QTC::TC("libtests", "JSON wanted dictionary");
            errors.push_back(err_prefix + " is supposed to be a dictionary");
            return false;
        }
        auto members = sch_dict->members;
        std::string key;
        if ((members.size() == 1) &&
            ((key = members.begin()->first, key.length() > 2) && (key.at(0) == '<') &&
             (key.at(key.length() - 1) == '>'))) {
            pattern_key = key;
        }
    }

    if (sch_dict && (!pattern_key.empty())) {
        auto pattern_schema = sch_dict->members[pattern_key].m->value.get();
        for (auto const& iter: this_dict->members) {
            std::string const& key = iter.first;
            checkSchemaInternal(
                this_dict->members[key].m->value.get(),
                pattern_schema,
                flags,
                errors,
                prefix + "." + key);
        }
    } else if (sch_dict) {
        for (auto& iter: sch_dict->members) {
            std::string const& key = iter.first;
            if (this_dict->members.count(key)) {
                checkSchemaInternal(
                    this_dict->members[key].m->value.get(),
                    iter.second.m->value.get(),
                    flags,
                    errors,
                    prefix + "." + key);
            } else {
                if (flags & f_optional) {
                    QTC::TC("libtests", "JSON optional key");
                } else {
                    QTC::TC("libtests", "JSON key missing in object");
                    errors.push_back(
                        err_prefix + ": key \"" + key +
                        "\" is present in schema but missing in object");
                }
            }
        }
        for (auto const& iter: this_dict->members) {
            std::string const& key = iter.first;
            if (sch_dict->members.count(key) == 0) {
                QTC::TC("libtests", "JSON key extra in object");
                errors.push_back(
                    err_prefix + ": key \"" + key +
                    "\" is not present in schema but appears in object");
            }
        }
    } else if (sch_arr) {
        auto n_elements = sch_arr->elements.size();
        if (n_elements == 1) {
            // A single-element array in the schema allows a single element in the object or a
            // variable-length array, each of whose items must conform to the single element of the
            // schema array. This doesn't apply to arrays of arrays -- we fall back to the behavior
            // of allowing a single item only when the object is not an array.
            if (this_arr) {
                int i = 0;
                for (auto const& element: this_arr->elements) {
                    checkSchemaInternal(
                        element.m->value.get(),
                        sch_arr->elements.at(0).m->value.get(),
                        flags,
                        errors,
                        prefix + "." + std::to_string(i));
                    ++i;
                }
            } else {
                QTC::TC("libtests", "JSON schema array for single item");
                checkSchemaInternal(
                    this_v, sch_arr->elements.at(0).m->value.get(), flags, errors, prefix);
            }
        } else if (!this_arr || (this_arr->elements.size() != n_elements)) {
            QTC::TC("libtests", "JSON schema array length mismatch");
            errors.push_back(
                err_prefix + " is supposed to be an array of length " + std::to_string(n_elements));
            return false;
        } else {
            // A multi-element array in the schema must correspond to an element of the same length
            // in the object. Each element in the object is validated against the corresponding
            // element in the schema.
            size_t i = 0;
            for (auto const& element: this_arr->elements) {
                checkSchemaInternal(
                    element.m->value.get(),
                    sch_arr->elements.at(i).m->value.get(),
                    flags,
                    errors,
                    prefix + "." + std::to_string(i));
                ++i;
            }
        }
    } else if (!sch_str) {
        QTC::TC("libtests", "JSON schema other type");
        errors.push_back(err_prefix + " schema value is not dictionary, array, or string");
        return false;
    }

    return errors.empty();
}